

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_add_range_closed(roaring_bitmap_t *r,uint32_t min,uint32_t max)

{
  rle16_t *__src;
  uint16_t *puVar1;
  uint uVar2;
  int32_t iVar3;
  uint uVar4;
  array_container_t *run;
  long lVar5;
  uint uVar6;
  uint uVar7;
  rle16_t *prVar8;
  ushort ikey;
  uint uVar9;
  uint32_t uVar10;
  int32_t iVar11;
  roaring_array_t *prVar12;
  uint uVar13;
  uint16_t ikey_00;
  int iVar15;
  uint32_t key;
  uint32_t uVar16;
  int iVar17;
  bool bVar18;
  uint8_t new_type;
  uint32_t local_7c;
  roaring_array_t *local_78;
  ulong local_70;
  ulong local_68;
  uint32_t local_5c;
  int local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  array_container_t *local_48;
  ulong local_40;
  rle16_t *local_38;
  ulong uVar14;
  
  if (min <= max) {
    local_54 = max >> 0x10;
    iVar15 = local_54 - (min >> 0x10);
    puVar1 = (r->high_low_container).keys;
    iVar11 = (r->high_low_container).size;
    local_7c = max;
    local_78 = &r->high_low_container;
    local_5c = min;
    uVar2 = count_greater(puVar1,iVar11,(uint16_t)(max >> 0x10));
    local_40 = (ulong)(min >> 0x10);
    iVar3 = count_less(puVar1,iVar11 - uVar2,(uint16_t)(min >> 0x10));
    prVar12 = local_78;
    iVar17 = (iVar11 - uVar2) - iVar3;
    if (iVar17 <= iVar15) {
      ra_shift_tail(local_78,uVar2,(iVar15 - iVar17) + 1);
      iVar11 = prVar12->size;
    }
    local_50 = (iVar3 + iVar17) - 1;
    uVar9 = ~uVar2 + iVar11;
    local_4c = (int)local_40 - 1;
    local_5c = local_5c & 0xffff;
    uVar16 = local_7c & 0xffff;
    prVar12 = local_78;
    local_7c = uVar16;
    for (uVar2 = local_54; local_68 = (ulong)uVar9, uVar2 != local_4c; uVar2 = uVar2 - 1) {
      uVar9 = 0;
      if ((uint)local_40 == uVar2) {
        uVar9 = local_5c;
      }
      uVar10 = 0xffff;
      if (local_54 == uVar2) {
        uVar10 = uVar16;
      }
      if (((int)local_50 < 0) || (uVar2 != prVar12->keys[local_50])) {
        run = (array_container_t *)container_range_of_ones(uVar9,uVar10 + 1,&new_type);
        iVar15 = (int)local_68;
      }
      else {
        local_70 = (ulong)local_50;
        ra_unshare_container_at_index(prVar12,(uint16_t)local_50);
        run = (array_container_t *)prVar12->containers[local_70];
        ikey_00 = (uint16_t)uVar9;
        ikey = (ushort)uVar10;
        if (prVar12->typecodes[local_70] == '\x03') {
          prVar8 = (rle16_t *)run->array;
          uVar4 = run->cardinality;
          if (uVar4 == 0) {
            iVar15 = 0;
LAB_0010ebf9:
            lVar5 = 0;
            uVar13 = 0;
          }
          else {
            uVar7 = 0;
            uVar13 = uVar4;
            do {
              while( true ) {
                if ((int)uVar13 <= (int)uVar7) {
                  iVar15 = uVar4 - uVar7;
                  if (uVar7 == 0) goto LAB_0010ebf9;
                  goto LAB_0010eb5a;
                }
                uVar6 = uVar7 + (uVar13 - 1) >> 1;
                if (ikey <= (ushort)(prVar8[uVar6].length + prVar8[uVar6].value)) break;
                uVar7 = uVar6 + 1;
              }
              uVar13 = uVar6;
            } while (uVar10 + 1 < (uint)prVar8[uVar6].value);
            uVar7 = uVar6 + 1;
            iVar15 = ~uVar6 + uVar4;
LAB_0010eb5a:
            uVar6 = 0;
            uVar14 = (ulong)uVar7;
            do {
              iVar17 = (int)uVar14;
              while( true ) {
                uVar13 = uVar6;
                if (iVar17 <= (int)uVar6) goto LAB_0010ebb0;
                uVar13 = uVar6 + iVar17 + -1 >> 1;
                uVar14 = (ulong)uVar13;
                prVar12 = local_78;
                if (uVar9 <= (ushort)(prVar8[uVar14].length + prVar8[uVar14].value) + 1) break;
                uVar6 = uVar13 + 1;
              }
            } while (ikey_00 < prVar8[uVar14].value);
LAB_0010ebb0:
            lVar5 = (long)(int)uVar7;
          }
          iVar17 = uVar13 + iVar15 + 1;
          if (iVar17 * 4 < 0x2001) {
            if (uVar4 == uVar13 + iVar15) {
              makeRoomAtIndex((run_container_t *)run,(uint16_t)uVar13);
              prVar8 = (rle16_t *)run->array;
              prVar8[uVar13].value = ikey_00;
              prVar8[uVar13].length = ikey - ikey_00;
            }
            else {
              __src = prVar8 + lVar5;
              uVar4 = (uint)__src[-1].length + (uint)__src[-1].value;
              if (prVar8[uVar13].value < uVar9) {
                uVar9 = (uint)prVar8[uVar13].value;
              }
              if (uVar4 <= uVar10) {
                uVar4 = uVar10;
              }
              prVar8[uVar13].value = (uint16_t)uVar9;
              prVar8[uVar13].length = (short)uVar4 - (uint16_t)uVar9;
              memmove(prVar8 + (uVar13 + 1),__src,(long)iVar15 << 2);
              run->cardinality = iVar17;
            }
            new_type = '\x03';
            prVar12 = local_78;
          }
          else {
            run = (array_container_t *)
                  container_from_run_range((run_container_t *)run,uVar9,uVar10,&new_type);
          }
LAB_0010ecaf:
          iVar15 = (int)local_68;
        }
        else {
          if (prVar12->typecodes[local_70] != '\x02') {
            uVar10 = uVar10 - uVar9;
            iVar15 = run->cardinality;
            prVar8 = (rle16_t *)run->array;
            iVar17 = bitset_lenrange_cardinality((uint64_t *)prVar8,uVar9,uVar10);
            iVar15 = ((iVar15 + uVar10) - iVar17) + 1;
            if (iVar15 == 0x10000) goto LAB_0010eb35;
            new_type = '\x01';
LAB_0010ebd3:
            bitset_set_lenrange((uint64_t *)prVar8,uVar9,uVar10);
            run->cardinality = iVar15;
            prVar12 = local_78;
            goto LAB_0010ecaf;
          }
          prVar8 = (rle16_t *)run->array;
          iVar11 = run->cardinality;
          local_48 = run;
          iVar3 = count_greater((uint16_t *)prVar8,iVar11,ikey);
          iVar17 = iVar11 - iVar3;
          local_38 = prVar8;
          uVar4 = count_less((uint16_t *)prVar8,iVar17,ikey_00);
          run = local_48;
          uVar10 = uVar10 - uVar9;
          iVar15 = uVar10 + uVar4 + iVar3 + 1;
          if (iVar15 == 0x10000) {
LAB_0010eb35:
            new_type = '\x03';
            run = (array_container_t *)run_container_create_range(0,0x10000);
            prVar12 = local_78;
            goto LAB_0010ecaf;
          }
          if (0x1000 < iVar15) {
            new_type = '\x01';
            run = (array_container_t *)bitset_container_from_array(local_48);
            prVar8 = (rle16_t *)run->array;
            goto LAB_0010ebd3;
          }
          new_type = '\x02';
          prVar8 = local_38;
          local_58 = iVar15;
          if (local_48->capacity < iVar15) {
            array_container_grow(local_48,iVar15,true);
            prVar8 = (rle16_t *)run->array;
            iVar17 = run->cardinality - iVar3;
          }
          memmove(&prVar8->value + (int)(uVar10 + uVar4 + 1),&prVar8->value + iVar17,(long)iVar3 * 2
                 );
          puVar1 = run->array;
          lVar5 = (ulong)uVar10 + 1;
          iVar15 = (int)local_68;
          while (bVar18 = lVar5 != 0, lVar5 = lVar5 + -1, bVar18) {
            puVar1[uVar4] = (uint16_t)uVar9;
            uVar4 = uVar4 + 1;
            uVar9 = uVar9 + 1;
          }
          run->cardinality = local_58;
          prVar12 = local_78;
        }
        uVar16 = local_7c;
        if (run != (array_container_t *)prVar12->containers[local_70]) {
          container_free((array_container_t *)prVar12->containers[local_70],
                         prVar12->typecodes[local_70]);
        }
        local_50 = local_50 - 1;
      }
      ra_replace_key_and_container_at_index(prVar12,iVar15,(uint16_t)uVar2,run,new_type);
      uVar9 = iVar15 - 1;
    }
  }
  return;
}

Assistant:

void roaring_bitmap_add_range_closed(roaring_bitmap_t *r, uint32_t min, uint32_t max) {
    if (min > max) {
        return;
    }

    roaring_array_t *ra = &r->high_low_container;

    uint32_t min_key = min >> 16;
    uint32_t max_key = max >> 16;

    int32_t num_required_containers = max_key - min_key + 1;
    int32_t suffix_length = count_greater(ra->keys, ra->size, max_key);
    int32_t prefix_length = count_less(ra->keys, ra->size - suffix_length,
                                       min_key);
    int32_t common_length = ra->size - prefix_length - suffix_length;

    if (num_required_containers > common_length) {
        ra_shift_tail(ra, suffix_length,
                      num_required_containers - common_length);
    }

    int32_t src = prefix_length + common_length - 1;
    int32_t dst = ra->size - suffix_length - 1;
    for (uint32_t key = max_key; key != min_key-1; key--) { // beware of min_key==0
        uint32_t container_min = (min_key == key) ? (min & 0xffff) : 0;
        uint32_t container_max = (max_key == key) ? (max & 0xffff) : 0xffff;
        container_t* new_container;
        uint8_t new_type;

        if (src >= 0 && ra->keys[src] == key) {
            ra_unshare_container_at_index(ra, src);
            new_container = container_add_range(ra->containers[src],
                                                ra->typecodes[src],
                                                container_min, container_max,
                                                &new_type);
            if (new_container != ra->containers[src]) {
                container_free(ra->containers[src],
                               ra->typecodes[src]);
            }
            src--;
        } else {
            new_container = container_from_range(&new_type, container_min,
                                                 container_max+1, 1);
        }
        ra_replace_key_and_container_at_index(ra, dst, key, new_container,
                                              new_type);
        dst--;
    }
}